

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::CompactData::getUniquePatterns
          (CompactData *this,UVector *output,UErrorCode *status)

{
  UChar *s1;
  int32_t iVar1;
  UChar *s2;
  int local_44;
  int32_t i;
  UChar *pattern;
  UChar **__end1;
  UChar **__begin1;
  UChar *(*__range1) [96];
  UErrorCode *status_local;
  UVector *output_local;
  CompactData *this_local;
  
  __end1 = this->patterns;
  do {
    if (__end1 == (UChar **)this->multipliers) {
      return;
    }
    s1 = *__end1;
    if ((s1 != (UChar *)0x0) && (s1 != (UChar *)::(anonymous_namespace)::USE_FALLBACK)) {
      local_44 = UVector::size(output);
      do {
        local_44 = local_44 + -1;
        if (local_44 < 0) {
          UVector::addElement(output,s1,status);
          break;
        }
        s2 = (UChar *)UVector::operator[](output,local_44);
        iVar1 = u_strcmp_63(s1,s2);
      } while (iVar1 != 0);
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void CompactData::getUniquePatterns(UVector &output, UErrorCode &status) const {
    U_ASSERT(output.isEmpty());
    // NOTE: In C++, this is done more manually with a UVector.
    // In Java, we can take advantage of JDK HashSet.
    for (auto pattern : patterns) {
        if (pattern == nullptr || pattern == USE_FALLBACK) {
            continue;
        }

        // Insert pattern into the UVector if the UVector does not already contain the pattern.
        // Search the UVector from the end since identical patterns are likely to be adjacent.
        for (int32_t i = output.size() - 1; i >= 0; i--) {
            if (u_strcmp(pattern, static_cast<const UChar *>(output[i])) == 0) {
                goto continue_outer;
            }
        }

        // The string was not found; add it to the UVector.
        // ANDY: This requires a const_cast.  Why?
        output.addElement(const_cast<UChar *>(pattern), status);

        continue_outer:
        continue;
    }
}